

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLapsp.c
# Opt level: O1

void RDL_deleteAPSP(RDL_sPathInfo *info,uint V)

{
  ulong uVar1;
  
  RDL_delete2DUIntArray(info->pred,V);
  RDL_delete2DUIntArray(info->dist,V);
  RDL_delete2DCharArray(info->reachable,V);
  if (V != 0) {
    uVar1 = 0;
    do {
      RDL_deleteGraph(info->dPaths[uVar1]);
      uVar1 = uVar1 + 1;
    } while (V != uVar1);
  }
  free(info->dPaths);
  free(info);
  return;
}

Assistant:

void RDL_deleteAPSP(RDL_sPathInfo *info, unsigned V)
{
  unsigned i;
  RDL_delete2DUIntArray(info->pred, V);
  RDL_delete2DUIntArray(info->dist, V);
  RDL_delete2DCharArray(info->reachable, V);
  for(i=0; i<V; ++i)
  {
    RDL_deleteGraph(info->dPaths[i]);
  }
  free(info->dPaths);
  free(info);
}